

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatNotification.cpp
# Opt level: O0

EC_T_BOOL __thiscall
CEmNotification::EnqueueJob
          (CEmNotification *this,PT_SLAVEJOBS pJob,EC_T_DWORD dwCode,void *pSrc,EC_T_DWORD dwSize)

{
  CAtEmLogging *this_00;
  PT_SLAVEJOBS p_Var1;
  undefined8 uVar2;
  bool bVar3;
  PT_SLAVEJOBS pNewWrite;
  EC_T_BOOL bRet;
  EC_T_DWORD dwSize_local;
  void *pSrc_local;
  EC_T_DWORD dwCode_local;
  PT_SLAVEJOBS pJob_local;
  CEmNotification *this_local;
  
  p_Var1 = IncrementJobPtr(this,(this->m_oSlaveJobQueue).pWrite);
  bVar3 = p_Var1 != (this->m_oSlaveJobQueue).pRead;
  if (bVar3) {
    pJob->dwCode = dwCode;
    memcpy(&pJob->JobData,pSrc,(ulong)dwSize);
    memcpy((this->m_oSlaveJobQueue).pWrite,pJob,0x5ec);
    (this->m_oSlaveJobQueue).pWrite = p_Var1;
  }
  pNewWrite._0_4_ = (uint)bVar3;
  if ((uint)pNewWrite == 0) {
    this_00 = this->m_pcLogging;
    uVar2 = ecatGetNotifyText(dwCode);
    CAtEmLogging::LogError
              (this_00,
               "ERROR: Unable to enqueue %s job! Missing calls to ProcessNotificationJobs or queue too small."
               ,uVar2);
  }
  return (uint)pNewWrite;
}

Assistant:

EC_T_BOOL CEmNotification::EnqueueJob(
    PT_SLAVEJOBS pJob, 
    EC_T_DWORD dwCode, 
    EC_T_VOID* pSrc, 
    EC_T_DWORD dwSize       
                                     )
{
    EC_T_BOOL    bRet      = EC_FALSE;
    PT_SLAVEJOBS pNewWrite = EC_NULL;

    pNewWrite = IncrementJobPtr(m_oSlaveJobQueue.pWrite);

    if (pNewWrite == m_oSlaveJobQueue.pRead)
    {
        /* no more space in queue */
        goto Exit;
    }

    /* store job */
    pJob->dwCode = dwCode;
    OsMemcpy(&(pJob->JobData), pSrc, dwSize);
    OsMemcpy(m_oSlaveJobQueue.pWrite, pJob, sizeof(T_SLAVEJOBS));

    /* increment write pointer */
    m_oSlaveJobQueue.pWrite = pNewWrite;

    bRet = EC_TRUE;
Exit:
    if (!bRet)
    {
        LogError("ERROR: Unable to enqueue %s job! Missing calls to ProcessNotificationJobs or queue too small.", ecatGetNotifyText(dwCode));
    }

    return bRet;
}